

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::VersionSet::ReuseManifest(VersionSet *this,string *dscname,string *dscbase)

{
  Logger *pLVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  undefined8 uVar6;
  Writer *this_00;
  string local_78;
  Status local_58;
  Status r;
  Status local_48;
  ulong local_40;
  uint64_t manifest_size;
  uint64_t manifest_number;
  string *psStack_28;
  FileType manifest_type;
  string *dscbase_local;
  string *dscname_local;
  VersionSet *this_local;
  
  if ((this->options_->reuse_logs & 1U) == 0) {
    this_local._7_1_ = 0;
  }
  else {
    psStack_28 = dscbase;
    dscbase_local = dscname;
    dscname_local = (string *)this;
    bVar3 = ParseFileName(dscbase,&manifest_size,(FileType *)((long)&manifest_number + 4));
    r.state_._7_1_ = 0;
    bVar4 = true;
    if ((bVar3) && (bVar4 = true, manifest_number._4_4_ == 3)) {
      (*this->env_->_vptr_Env[0xd])(&local_48,this->env_,dscbase_local,&local_40);
      r.state_._7_1_ = 1;
      bVar3 = Status::ok(&local_48);
      uVar2 = local_40;
      bVar4 = true;
      if (bVar3) {
        sVar5 = TargetFileSize(this->options_);
        bVar4 = sVar5 <= uVar2;
      }
    }
    if ((r.state_._7_1_ & 1) != 0) {
      Status::~Status(&local_48);
    }
    if (bVar4) {
      this_local._7_1_ = 0;
    }
    else {
      if (this->descriptor_file_ != (WritableFile *)0x0) {
        __assert_fail("descriptor_file_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                      ,0x3ed,
                      "bool leveldb::VersionSet::ReuseManifest(const std::string &, const std::string &)"
                     );
      }
      if (this->descriptor_log_ != (Writer *)0x0) {
        __assert_fail("descriptor_log_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                      ,0x3ee,
                      "bool leveldb::VersionSet::ReuseManifest(const std::string &, const std::string &)"
                     );
      }
      (*this->env_->_vptr_Env[5])(&local_58,this->env_,dscbase_local,&this->descriptor_file_);
      bVar4 = Status::ok(&local_58);
      if (bVar4) {
        pLVar1 = this->options_->info_log;
        uVar6 = std::__cxx11::string::c_str();
        Log(pLVar1,"Reusing MANIFEST %s\n",uVar6);
        this_00 = (Writer *)operator_new(0x20);
        log::Writer::Writer(this_00,this->descriptor_file_,local_40);
        this->descriptor_log_ = this_00;
        this->manifest_file_number_ = manifest_size;
        this_local._7_1_ = 1;
      }
      else {
        pLVar1 = this->options_->info_log;
        Status::ToString_abi_cxx11_(&local_78,&local_58);
        uVar6 = std::__cxx11::string::c_str();
        Log(pLVar1,"Reuse MANIFEST: %s\n",uVar6);
        std::__cxx11::string::~string((string *)&local_78);
        if (this->descriptor_file_ != (WritableFile *)0x0) {
          __assert_fail("descriptor_file_ == nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                        ,0x3f2,
                        "bool leveldb::VersionSet::ReuseManifest(const std::string &, const std::string &)"
                       );
        }
        this_local._7_1_ = 0;
      }
      Status::~Status(&local_58);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool VersionSet::ReuseManifest(const std::string& dscname,
                               const std::string& dscbase) {
  if (!options_->reuse_logs) {
    return false;
  }
  FileType manifest_type;
  uint64_t manifest_number;
  uint64_t manifest_size;
  if (!ParseFileName(dscbase, &manifest_number, &manifest_type) ||
      manifest_type != kDescriptorFile ||
      !env_->GetFileSize(dscname, &manifest_size).ok() ||
      // Make new compacted MANIFEST if old one is too big
      manifest_size >= TargetFileSize(options_)) {
    return false;
  }

  assert(descriptor_file_ == nullptr);
  assert(descriptor_log_ == nullptr);
  Status r = env_->NewAppendableFile(dscname, &descriptor_file_);
  if (!r.ok()) {
    Log(options_->info_log, "Reuse MANIFEST: %s\n", r.ToString().c_str());
    assert(descriptor_file_ == nullptr);
    return false;
  }

  Log(options_->info_log, "Reusing MANIFEST %s\n", dscname.c_str());
  descriptor_log_ = new log::Writer(descriptor_file_, manifest_size);
  manifest_file_number_ = manifest_number;
  return true;
}